

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstack.h
# Opt level: O2

longdouble * __thiscall
TPZStack<long_double,_10>::Pop(longdouble *__return_storage_ptr__,TPZStack<long_double,_10> *this)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  longdouble *plVar4;
  
  lVar2 = *(long *)(__return_storage_ptr__ + 1);
  lVar1 = lVar2 + -1;
  *(long *)(__return_storage_ptr__ + 1) = lVar1;
  if (0 < lVar2) {
    return (longdouble *)(lVar1 * 0x10);
  }
  *(undefined8 *)(__return_storage_ptr__ + 1) = 0;
  poVar3 = std::operator<<((ostream *)&std::cerr,"TPZStack popping beyond the stack object");
  std::endl<char,std::char_traits<char>>(poVar3);
  plVar4 = (longdouble *)std::ostream::flush();
  return plVar4;
}

Assistant:

T TPZStack<T, NumExtAlloc>::Pop() {
	this->fNElements--;
	if(this->fNElements <0){
		this->fNElements = 0;
		PZError << "TPZStack popping beyond the stack object" << std::endl;
		PZError.flush();
		T temp(0);
		return temp;
	}
	return this->fStore[this->fNElements];
}